

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  _Rb_tree_header *p_Var1;
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  _Any_data local_10a8;
  code *local_1098;
  code *local_1090;
  _Any_data local_1088;
  code *local_1078;
  code *local_1070;
  _Any_data local_1068;
  code *local_1058;
  code *local_1050;
  _Any_data local_1048;
  code *local_1038;
  code *local_1030;
  _Any_data local_1028;
  code *local_1018;
  code *local_1010;
  _Any_data local_1008;
  code *local_ff8;
  code *local_ff0;
  _Any_data local_fe8;
  code *local_fd8;
  code *local_fd0;
  _Any_data local_fc8;
  code *local_fb8;
  code *local_fb0;
  _Any_data local_fa8;
  code *local_f98;
  code *local_f90;
  _Any_data local_f88;
  code *local_f78;
  code *local_f70;
  _Any_data local_f68;
  code *local_f58;
  code *local_f50;
  _Any_data local_f48;
  code *local_f38;
  code *local_f30;
  _Any_data local_f28;
  code *local_f18;
  code *local_f10;
  _Any_data local_f08;
  code *local_ef8;
  code *local_ef0;
  _Any_data local_ee8;
  code *local_ed8;
  code *local_ed0;
  _Any_data local_ec8;
  code *local_eb8;
  code *local_eb0;
  _Any_data local_ea8;
  code *local_e98;
  code *local_e90;
  _Any_data local_e88;
  code *local_e78;
  code *local_e70;
  _Any_data local_e68;
  code *local_e58;
  code *local_e50;
  _Any_data local_e48;
  code *local_e38;
  code *local_e30;
  _Any_data local_e28;
  code *local_e18;
  code *local_e10;
  _Any_data local_e08;
  code *local_df8;
  code *local_df0;
  _Any_data local_de8;
  code *local_dd8;
  code *local_dd0;
  _Any_data local_dc8;
  code *local_db8;
  code *local_db0;
  _Any_data local_da8;
  code *local_d98;
  code *local_d90;
  _Any_data local_d88;
  code *local_d78;
  code *local_d70;
  _Any_data local_d68;
  code *local_d58;
  code *local_d50;
  Mode local_d48 [12];
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8 [32];
  string local_398;
  string local_378;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_358;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_340;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_328;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_310;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2f8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2e0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2c8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_2b0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_298;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_280;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_268;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_250;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_238;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_220;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_208;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1f0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1d8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1c0;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_1a8;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_190;
  _Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
  local_178;
  Mode local_15c [31];
  string local_e0;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  allocator<char> local_b8;
  allocator<char> local_b7;
  allocator<char> local_b6;
  allocator<char> local_b5;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  allocator_type local_b0;
  allocator<char> local_af;
  allocator<char> local_ae;
  allocator<char> local_ad;
  allocator_type local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  allocator_type local_a8;
  allocator<char> local_a7;
  allocator<char> local_a6;
  allocator<char> local_a5;
  allocator_type local_a4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  allocator_type local_a0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  allocator_type local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  allocator_type local_98;
  allocator<char> local_97;
  allocator<char> local_96;
  allocator<char> local_95;
  allocator_type local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  allocator_type local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator_type local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator_type local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator_type local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator_type local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator_type local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator_type local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator_type local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator_type local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator_type local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator_type local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator_type local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator_type local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string WasmSplitOption;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"wasm-split",(allocator<char> *)&local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,(allocator<char> *)&local_378);
  ToolOptions::ToolOptions(&this->super_ToolOptions,(string *)local_58,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_58);
  this->unescape = false;
  this->verbose = false;
  this->mode = Split;
  this->storageKind = InGlobals;
  this->emitBinary = true;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  (this->profileFile)._M_dataplus._M_p = (pointer)&(this->profileFile).field_2;
  (this->profileFile)._M_string_length = 0;
  (this->profileFile).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&this->profileExport,(string *)DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  p_Var1 = &(this->keepFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->splitFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->primaryOutput)._M_dataplus._M_p = (pointer)&(this->primaryOutput).field_2;
  (this->primaryOutput)._M_string_length = 0;
  (this->primaryOutput).field_2._M_local_buf[0] = '\0';
  (this->secondaryOutput)._M_dataplus._M_p = (pointer)&(this->secondaryOutput).field_2;
  (this->secondaryOutput)._M_string_length = 0;
  (this->secondaryOutput).field_2._M_local_buf[0] = '\0';
  (this->importNamespace)._M_dataplus._M_p = (pointer)&(this->importNamespace).field_2;
  (this->importNamespace)._M_string_length = 0;
  (this->importNamespace).field_2._M_local_buf[0] = '\0';
  (this->placeholderNamespace)._M_dataplus._M_p = (pointer)&(this->placeholderNamespace).field_2;
  (this->placeholderNamespace)._M_string_length = 0;
  (this->placeholderNamespace).field_2._M_local_buf[0] = '\0';
  (this->secondaryMemoryName)._M_dataplus._M_p = (pointer)&(this->secondaryMemoryName).field_2;
  (this->secondaryMemoryName)._M_string_length = 0;
  (this->secondaryMemoryName).field_2._M_local_buf[0] = '\0';
  (this->exportPrefix)._M_dataplus._M_p = (pointer)&(this->exportPrefix).field_2;
  (this->exportPrefix)._M_string_length = 0;
  (this->exportPrefix).field_2._M_local_buf[0] = '\0';
  this->initialTableSize = -1;
  std::
  array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
  ::array(&this->validOptions);
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"wasm-split options",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"--split",&local_bc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_bb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Split an input module into two output modules. The default mode."
             ,&local_ba);
  local_10a8._8_8_ = 0;
  local_1090 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:94:10)>
               ::_M_invoke;
  local_1098 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:94:10)>
               ::_M_manager;
  local_10a8._M_unused._M_object = this;
  add(this,&local_e0,&local_398,&local_378,(string *)local_58,Zero,(Action *)&local_10a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"--instrument",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf8,"",&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,&local_b7);
  local_1088._8_8_ = 0;
  local_1070 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:102:7)>
               ::_M_invoke;
  local_1078 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:102:7)>
               ::_M_manager;
  local_1088._M_unused._M_object = this;
  add(this,&local_d18,&local_cf8,&local_cd8,(string *)local_58,Zero,(Action *)&local_1088);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb8,"--merge-profiles",&local_b6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"",&local_b5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,
             "Merge multiple profiles for the same module into a single profile.",&local_b4);
  local_1068._8_8_ = 0;
  local_1050 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:108:10)>
               ::_M_invoke;
  local_1058 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:108:10)>
               ::_M_manager;
  local_1068._M_unused._M_object = this;
  add(this,&local_cb8,&local_c98,&local_c78,(string *)local_58,Zero,(Action *)&local_1068);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c58,"--print-profile",&local_b3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"",&local_b2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c18,"Print profile contents in a human-readable format.",&local_b1);
  local_15c[0] = PrintProfile;
  __l._M_len = 1;
  __l._M_array = local_15c;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_358,__l,&local_b0);
  local_1048._8_8_ = 0;
  local_1030 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:117:10)>
               ::_M_invoke;
  local_1038 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:117:10)>
               ::_M_manager;
  local_1048._M_unused._M_object = this;
  add(this,&local_c58,&local_c38,&local_c18,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_358,One,(Action *)&local_1048);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf8,"--profile",&local_af);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,"",&local_ae);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb8,"The profile to use to guide splitting.",&local_ad);
  local_15c[1] = 0;
  __l_00._M_len = 1;
  __l_00._M_array = local_15c + 1;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_340,__l_00,&local_ac);
  local_1028._8_8_ = 0;
  local_1010 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:128:7)>
               ::_M_invoke;
  local_1018 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:128:7)>
               ::_M_manager;
  local_1028._M_unused._M_object = this;
  add(this,&local_bf8,&local_bd8,&local_bb8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_340,One,(Action *)&local_1028);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b98,"--keep-funcs",&local_ab);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Cannot be used with --profile or --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_a9);
  local_15c[2] = 0;
  __l_01._M_len = 1;
  __l_01._M_array = local_15c + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_328,__l_01,&local_a8);
  local_1008._8_8_ = 0;
  local_ff0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:138:10)>
              ::_M_invoke;
  local_ff8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:138:10)>
              ::_M_manager;
  local_1008._M_unused._M_object = this;
  add(this,&local_b98,&local_b78,&local_b58,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_328,One,(Action *)&local_1008);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"--split-funcs",&local_a7)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,"",&local_a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Cannot be used with --profile or --keep-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_a5);
  local_15c[3] = 0;
  __l_02._M_len = 1;
  __l_02._M_array = local_15c + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_310,__l_02,&local_a4);
  local_fe8._8_8_ = 0;
  local_fd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:150:10)>
              ::_M_invoke;
  local_fd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:150:10)>
              ::_M_manager;
  local_fe8._M_unused._M_object = this;
  add(this,&local_b38,&local_b18,&local_af8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_310,One,(Action *)&local_fe8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad8,"--primary-output",&local_a3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"-o1",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"Output file for the primary module.",&local_a1);
  local_15c[4] = 0;
  __l_03._M_len = 1;
  __l_03._M_array = local_15c + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2f8,__l_03,&local_a0);
  local_fc8._8_8_ = 0;
  local_fb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:159:10)>
              ::_M_invoke;
  local_fb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:159:10)>
              ::_M_manager;
  local_fc8._M_unused._M_object = this;
  add(this,&local_ad8,&local_ab8,&local_a98,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2f8,One,(Action *)&local_fc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,"--secondary-output",&local_9f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"-o2",&local_9e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"Output file for the secondary module.",&local_9d);
  local_15c[5] = 0;
  __l_04._M_len = 1;
  __l_04._M_array = local_15c + 5;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2e0,__l_04,&local_9c);
  local_fa8._8_8_ = 0;
  local_f90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:168:10)>
              ::_M_invoke;
  local_f98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:168:10)>
              ::_M_manager;
  local_fa8._M_unused._M_object = this;
  add(this,&local_a78,&local_a58,&local_a38,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2e0,One,(Action *)&local_fa8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"--symbolmap",&local_9b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d8,"Write a symbol map file for each of the output modules.",
             &local_99);
  local_15c[6] = 0;
  __l_05._M_len = 1;
  __l_05._M_array = local_15c + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2c8,__l_05,&local_98);
  local_f88._8_8_ = 0;
  local_f70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:177:10)>
              ::_M_invoke;
  local_f78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:177:10)>
              ::_M_manager;
  local_f88._M_unused._M_object = this;
  add(this,&local_a18,&local_9f8,&local_9d8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2c8,Zero,(Action *)&local_f88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"--placeholdermap",&local_97);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"",&local_96);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"Write a file mapping placeholder indices to the function names.",
             &local_95);
  local_15c[7] = 0;
  __l_06._M_len = 1;
  __l_06._M_array = local_15c + 7;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_2b0,__l_06,&local_94);
  local_f68._8_8_ = 0;
  local_f50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:185:7)>
              ::_M_invoke;
  local_f58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:185:7)>
              ::_M_manager;
  local_f68._M_unused._M_object = this;
  add(this,&local_9b8,&local_998,&local_978,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_2b0,Zero,(Action *)&local_f68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"--import-namespace",&local_93);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,&local_91);
  local_d48[0] = Split;
  local_d48[1] = Instrument;
  __l_07._M_len = 2;
  __l_07._M_array = local_d48;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_298,__l_07,&local_90);
  local_f48._8_8_ = 0;
  local_f30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:195:10)>
              ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:195:10)>
              ::_M_manager;
  local_f48._M_unused._M_object = this;
  add(this,&local_958,&local_938,&local_918,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_298,One,(Action *)&local_f48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"--placeholder-namespace",&local_8f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"",&local_8e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,
             "The namespace from which to import placeholder functions into the primary module.",
             &local_8d);
  local_15c[8] = 0;
  __l_08._M_len = 1;
  __l_08._M_array = local_15c + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_280,__l_08,&local_8c);
  local_f28._8_8_ = 0;
  local_f10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:205:10)>
              ::_M_invoke;
  local_f18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:205:10)>
              ::_M_manager;
  local_f28._M_unused._M_object = this;
  add(this,&local_8f8,&local_8d8,&local_8b8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_280,One,(Action *)&local_f28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"--jspi",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,&local_89);
  local_15c[9] = 0;
  __l_09._M_len = 1;
  __l_09._M_array = local_15c + 9;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_268,__l_09,&local_88);
  local_f08._8_8_ = 0;
  local_ef0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:215:10)>
              ::_M_invoke;
  local_ef8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:215:10)>
              ::_M_manager;
  local_f08._M_unused._M_object = this;
  add(this,&local_898,&local_878,&local_858,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_268,Zero,(Action *)&local_f08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"--export-prefix",&local_87);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"",&local_86);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,
             "An identifying prefix to prepend to new export names created by module splitting.",
             &local_85);
  local_15c[10] = 0;
  __l_10._M_len = 1;
  __l_10._M_array = local_15c + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_250,__l_10,&local_84);
  local_ee8._8_8_ = 0;
  local_ed0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:224:7)>
              ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:224:7)>
              ::_M_manager;
  local_ee8._M_unused._M_object = this;
  add(this,&local_838,&local_818,&local_7f8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_250,One,(Action *)&local_ee8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"--profile-export",&local_83);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"",&local_82);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,&local_81);
  local_15c[0xb] = 1;
  __l_11._M_len = 1;
  __l_11._M_array = local_15c + 0xb;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_238,__l_11,&local_80);
  local_ec8._8_8_ = 0;
  local_eb0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:232:10)>
              ::_M_invoke;
  local_eb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:232:10)>
              ::_M_manager;
  local_ec8._M_unused._M_object = this;
  add(this,&local_7d8,&local_7b8,&local_798,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_238,One,(Action *)&local_ec8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"--in-memory",&local_7f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"",&local_7e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,&local_7d);
  local_15c[0xc] = 1;
  __l_12._M_len = 1;
  __l_12._M_array = local_15c + 0xc;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_220,__l_12,&local_7c);
  local_ea8._8_8_ = 0;
  local_e90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:246:7)>
              ::_M_invoke;
  local_e98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:246:7)>
              ::_M_manager;
  local_ea8._M_unused._M_object = this;
  add(this,&local_778,&local_758,&local_738,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_220,Zero,(Action *)&local_ea8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"--in-secondary-memory",&local_7b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"",&local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,&local_79);
  local_15c[0xd] = 1;
  __l_13._M_len = 1;
  __l_13._M_array = local_15c + 0xd;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_208,__l_13,&local_78);
  local_e88._8_8_ = 0;
  local_e70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:259:7)>
              ::_M_invoke;
  local_e78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:259:7)>
              ::_M_manager;
  local_e88._M_unused._M_object = this;
  add(this,&local_718,&local_6f8,&local_6d8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_208,Zero,(Action *)&local_e88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"--secondary-memory-name",&local_77);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"",&local_76);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,
             "The name of the secondary memory created to store profile information.",&local_75);
  local_15c[0xe] = 1;
  __l_14._M_len = 1;
  __l_14._M_array = local_15c + 0xe;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1f0,__l_14,&local_74);
  local_e68._8_8_ = 0;
  local_e50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:269:10)>
              ::_M_invoke;
  local_e58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:269:10)>
              ::_M_manager;
  local_e68._M_unused._M_object = this;
  add(this,&local_6b8,&local_698,&local_678,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1f0,One,(Action *)&local_e68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"--emit-module-names",&local_73);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,&local_71);
  local_d48[2] = Split;
  local_d48[3] = Instrument;
  __l_15._M_len = 2;
  __l_15._M_array = local_d48 + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1d8,__l_15,&local_70);
  local_e48._8_8_ = 0;
  local_e30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:282:7)>
              ::_M_invoke;
  local_e38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:282:7)>
              ::_M_manager;
  local_e48._M_unused._M_object = this;
  add(this,&local_658,&local_638,&local_618,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1d8,Zero,(Action *)&local_e48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"--initial-table",&local_6f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"",&local_6e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,&local_6d);
  local_d48[4] = Split;
  local_d48[5] = Instrument;
  __l_16._M_len = 2;
  __l_16._M_array = local_d48 + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1c0,__l_16,&local_6c);
  local_e28._8_8_ = 0;
  local_e10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:292:10)>
              ::_M_invoke;
  local_e18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:292:10)>
              ::_M_manager;
  local_e28._M_unused._M_object = this;
  add(this,&local_5f8,&local_5d8,&local_5b8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1c0,One,(Action *)&local_e28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"--emit-text",&local_6b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"-S",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Emit text instead of binary for the output file or files.",
             &local_69);
  local_d48[6] = Split;
  local_d48[7] = Instrument;
  __l_17._M_len = 2;
  __l_17._M_array = local_d48 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_1a8,__l_17,&local_68);
  local_e08._8_8_ = 0;
  local_df0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:301:10)>
              ::_M_invoke;
  local_df8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:301:10)>
              ::_M_manager;
  local_e08._M_unused._M_object = this;
  add(this,&local_598,&local_578,&local_558,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_1a8,Zero,(Action *)&local_e08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"--debuginfo",&local_67);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"-g",&local_66);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"Emit names section in wasm binary (or full debuginfo in wast)",
             &local_65);
  local_d48[8] = Split;
  local_d48[9] = Instrument;
  __l_18._M_len = 2;
  __l_18._M_array = local_d48 + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_190,__l_18,&local_64);
  local_de8._8_8_ = 0;
  local_dd0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:308:10)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:308:10)>
              ::_M_manager;
  local_de8._M_unused._M_object = this;
  add(this,&local_538,&local_518,&local_4f8,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_190,Zero,(Action *)&local_de8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"--output",&local_63);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"-o",&local_62);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"Output file.",&local_61);
  local_d48[10] = Instrument;
  local_d48[0xb] = MergeProfiles;
  __l_19._M_len = 2;
  __l_19._M_array = local_d48 + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            ((vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
             &local_178,__l_19,&local_60);
  local_dc8._8_8_ = 0;
  local_db0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:317:10)>
              ::_M_invoke;
  local_db8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:317:10)>
              ::_M_manager;
  local_dc8._M_unused._M_object = this;
  add(this,&local_4d8,&local_4b8,&local_498,(string *)local_58,
      (vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> *)
      &local_178,One,(Action *)&local_dc8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"--unescape",&local_5f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"-u",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"Un-escape function names (in print-profile output)",&local_5d);
  local_da8._8_8_ = 0;
  local_d90 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:323:10)>
              ::_M_invoke;
  local_d98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:323:10)>
              ::_M_manager;
  local_da8._M_unused._M_object = this;
  add(this,&local_478,&local_458,&local_438,(string *)local_58,Zero,(Action *)&local_da8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"--verbose",&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"-v",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,&local_5a);
  local_d88._8_8_ = 0;
  local_d70 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:330:10)>
              ::_M_invoke;
  local_d78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:330:10)>
              ::_M_manager;
  local_d88._M_unused._M_object = this;
  add(this,&local_418,&local_3f8,&local_3d8,(string *)local_58,Zero,(Action *)&local_d88);
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"INFILES",&local_59);
  local_d68._8_8_ = 0;
  local_d50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:336:21)>
              ::_M_invoke;
  local_d58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/split-options.cpp:336:21)>
              ::_M_manager;
  local_d68._M_unused._M_object = this;
  wasm::Options::add_positional((string *)this,(Arguments)local_3b8,(function *)0x2);
  std::_Function_base::~_Function_base((_Function_base *)&local_d68);
  std::__cxx11::string::~string(local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d88);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::_Function_base::~_Function_base((_Function_base *)&local_da8);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::_Function_base::~_Function_base((_Function_base *)&local_dc8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_178);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_de8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_190);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::_Function_base::~_Function_base((_Function_base *)&local_e08);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1a8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::_Function_base::~_Function_base((_Function_base *)&local_e28);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1c0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e48);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1d8);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_658);
  std::_Function_base::~_Function_base((_Function_base *)&local_e68);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_1f0);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e88);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_208);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::_Function_base::~_Function_base((_Function_base *)&local_ea8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_220);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::_Function_base::~_Function_base((_Function_base *)&local_ec8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_238);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_ee8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_250);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_838);
  std::_Function_base::~_Function_base((_Function_base *)&local_f08);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_268);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_898);
  std::_Function_base::~_Function_base((_Function_base *)&local_f28);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_280);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f48);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_298);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_958);
  std::_Function_base::~_Function_base((_Function_base *)&local_f68);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2b0);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f88);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2c8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::_Function_base::~_Function_base((_Function_base *)&local_fa8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2e0);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a78);
  std::_Function_base::~_Function_base((_Function_base *)&local_fc8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_2f8);
  std::__cxx11::string::~string((string *)&local_a98);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::_Function_base::~_Function_base((_Function_base *)&local_fe8);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_310);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_b38);
  std::_Function_base::~_Function_base((_Function_base *)&local_1008);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_328);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::_Function_base::~_Function_base((_Function_base *)&local_1028);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_340);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  std::_Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::
  ~_Vector_base(&local_358);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string((string *)&local_c38);
  std::__cxx11::string::~string((string *)&local_c58);
  std::_Function_base::~_Function_base((_Function_base *)&local_1068);
  std::__cxx11::string::~string((string *)&local_c78);
  std::__cxx11::string::~string((string *)&local_c98);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1088);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::string::~string((string *)&local_d18);
  std::_Function_base::~_Function_base((_Function_base *)&local_10a8);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arugment) { mode = Mode::Split; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Cannot be used with --profile or "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Cannot be used with --profile or "
         "--keep-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
         })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}